

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple.cc
# Opt level: O0

int main(void)

{
  future<void> local_d0;
  int local_bc;
  ThreadPool local_b8 [4];
  int i;
  ThreadPool t;
  
  ThreadPool::ThreadPool(local_b8,true);
  for (local_bc = 0; local_bc < 0x14; local_bc = local_bc + 1) {
    ThreadPool::submit<void(&)()>((ThreadPool *)&local_d0,(_func_void *)local_b8);
    std::future<void>::~future(&local_d0);
  }
  ThreadPool::~ThreadPool(local_b8);
  return 0;
}

Assistant:

int main(void)
{
    ThreadPool t;

    for (int i = 0; i < 20; ++i)
        t.submit(long_work);

    return 0;
}